

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.h
# Opt level: O3

void __thiscall
RigidBodyDynamics::Constraint::addInBaumgarteStabilizationForces
          (Constraint *this,VectorNd *errPosSys,VectorNd *errVelSys,VectorNd *gammaSysOutput)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar5 = (ulong)this->sizeOfConstraint;
  if (uVar5 != 0) {
    uVar6 = this->rowInSystem;
    pdVar2 = (errVelSys->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    pdVar3 = (errPosSys->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    pdVar4 = (gammaSysOutput->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_data;
    do {
      dVar1 = (this->baumgarteParameters).super_Vector2d.
              super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
      ;
      pdVar4[uVar6] =
           ((this->baumgarteParameters).super_Vector2d.
            super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] *
            -2.0 * pdVar2[uVar6] - dVar1 * dVar1 * pdVar3[uVar6]) + pdVar4[uVar6];
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void addInBaumgarteStabilizationForces(const Math::VectorNd &errPosSys,
                                           const Math::VectorNd &errVelSys,
                                           Math::VectorNd &gammaSysOutput)
    {

      //Here a for loop is used rather than a block operation
      //to be compatible with SimpleMath.
      for(unsigned int i=0; i<sizeOfConstraint;++i){
        gammaSysOutput[rowInSystem+i] +=
              -2.*baumgarteParameters[0]*errVelSys[rowInSystem+i]
             -(baumgarteParameters[1]*baumgarteParameters[1]
              )*errPosSys[rowInSystem+i];
      }
    }